

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O2

int duckdb_brotli::BrotliEnsureRingBuffer(BrotliDecoderStateInternal *s)

{
  int iVar1;
  uint8_t *__src;
  uint8_t *puVar2;
  int iVar3;
  
  iVar3 = 1;
  if (s->ringbuffer_size != s->new_ringbuffer_size) {
    __src = s->ringbuffer;
    puVar2 = (uint8_t *)
             (*s->alloc_func)(s->memory_manager_opaque,(long)s->new_ringbuffer_size + 0x21e);
    s->ringbuffer = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      s->ringbuffer = __src;
      iVar3 = 0;
    }
    else {
      puVar2[(long)s->new_ringbuffer_size + -2] = '\0';
      s->ringbuffer[(long)s->new_ringbuffer_size + -1] = '\0';
      if (__src != (uint8_t *)0x0) {
        switchD_0193dc74::default(s->ringbuffer,__src,(long)s->pos);
        (*s->free_func)(s->memory_manager_opaque,__src);
      }
      iVar1 = s->new_ringbuffer_size;
      s->ringbuffer_size = iVar1;
      s->ringbuffer_mask = iVar1 + -1;
      s->ringbuffer_end = s->ringbuffer + iVar1;
    }
  }
  return iVar3;
}

Assistant:

static BROTLI_BOOL BROTLI_NOINLINE BrotliEnsureRingBuffer(BrotliDecoderState *s) {
	uint8_t *old_ringbuffer = s->ringbuffer;
	if (s->ringbuffer_size == s->new_ringbuffer_size) {
		return BROTLI_TRUE;
	}

	s->ringbuffer = (uint8_t *)BROTLI_DECODER_ALLOC(s, (size_t)(s->new_ringbuffer_size) + kRingBufferWriteAheadSlack);
	if (s->ringbuffer == 0) {
		/* Restore previous value. */
		s->ringbuffer = old_ringbuffer;
		return BROTLI_FALSE;
	}
	s->ringbuffer[s->new_ringbuffer_size - 2] = 0;
	s->ringbuffer[s->new_ringbuffer_size - 1] = 0;

	if (!!old_ringbuffer) {
		memcpy(s->ringbuffer, old_ringbuffer, (size_t)s->pos);
		BROTLI_DECODER_FREE(s, old_ringbuffer);
	}

	s->ringbuffer_size = s->new_ringbuffer_size;
	s->ringbuffer_mask = s->new_ringbuffer_size - 1;
	s->ringbuffer_end = s->ringbuffer + s->ringbuffer_size;

	return BROTLI_TRUE;
}